

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
::clear_to_size(dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                *this,size_type new_num_buckets)

{
  int iVar1;
  pointer ppVar2;
  ulong uVar3;
  pointer ppVar4;
  size_type sVar5;
  float fVar6;
  
  if (this->table == (pointer)0x0) {
    ppVar2 = (pointer)malloc(new_num_buckets * 0x104);
  }
  else {
    if (this->num_buckets == new_num_buckets) goto LAB_00138ee8;
    ppVar2 = alloc_impl<google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
             ::realloc_or_die((alloc_impl<google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                               *)&this->field_0x238,this->table,new_num_buckets);
  }
  this->table = ppVar2;
LAB_00138ee8:
  iVar1 = g_num_copies;
  if (new_num_buckets != 0) {
    ppVar4 = this->table;
    sVar5 = new_num_buckets;
    do {
      (ppVar4->first).i_ = (this->key_info).empty_key.i_;
      memcpy((ppVar4->first).buffer_,(this->key_info).empty_key.buffer_,0xfc);
      ppVar4->second = 0;
      ppVar4 = ppVar4 + 1;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
    g_num_copies = iVar1 + (int)new_num_buckets;
  }
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = new_num_buckets;
  fVar6 = (this->settings).
          super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.enlarge_factor_
          * (float)new_num_buckets;
  uVar3 = (ulong)fVar6;
  (this->settings).super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar6 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  fVar6 = (float)new_num_buckets *
          (this->settings).
          super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.shrink_factor_;
  uVar3 = (ulong)fVar6;
  (this->settings).super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar6 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  (this->settings).super_sh_hashtable_settings<HashObject<256,_32>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  return;
}

Assistant:

void clear_to_size(size_type new_num_buckets) {
    if (!table) {
      table = val_info.allocate(new_num_buckets);
    } else {
      destroy_buckets(0, num_buckets);
      if (new_num_buckets != num_buckets) {  // resize, if necessary
        typedef std::integral_constant<
            bool, std::is_same<value_alloc_type,
                               libc_allocator_with_realloc<value_type>>::value>
            realloc_ok;
        resize_table(num_buckets, new_num_buckets, realloc_ok());
      }
    }
    assert(table);
    fill_range_with_empty(table, new_num_buckets);
    num_elements = 0;
    num_deleted = 0;
    num_buckets = new_num_buckets;  // our new size
    settings.reset_thresholds(bucket_count());
  }